

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O2

double anon_unknown.dwarf_1b803::sampleY<Imath_3_2::half>
                 (TypedImageChannel<Imath_3_2::half> *channel,int h,int x,double y,Extrapolation ext
                 )

{
  uint x_00;
  float fVar1;
  uint x_01;
  int iVar2;
  uint uVar3;
  half *phVar4;
  uint uVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  
  x_01 = Imath_3_2::floor<double>(y);
  x_00 = x_01 + 1;
  switch(ext) {
  case BLACK:
    dVar8 = 0.0;
    dVar7 = 0.0;
    if ((int)x_01 < h && -1 < (int)x_01) {
      dVar7 = (double)*(float *)(_imath_half_to_float_table +
                                (ulong)(channel->_pixels)._data
                                       [(ulong)x_01 * (channel->_pixels)._sizeY + (long)x]._h * 4);
    }
    if (h <= (int)x_00 || (int)x_01 < -1) goto LAB_00108aae;
    phVar4 = (channel->_pixels)._data + (ulong)x_00 * (channel->_pixels)._sizeY + (long)x;
    goto LAB_00108a98;
  case CLAMP:
    uVar3 = h - 1;
    uVar5 = uVar3;
    if ((int)x_01 < (int)uVar3) {
      uVar5 = x_01;
    }
    if ((int)x_01 < 0) {
      uVar5 = 0;
    }
    if ((int)x_00 < (int)uVar3) {
      uVar3 = x_00;
    }
    if ((int)x_01 < -1) {
      uVar3 = 0;
    }
    lVar6 = (channel->_pixels)._sizeY;
    phVar4 = (channel->_pixels)._data;
    fVar1 = *(float *)(_imath_half_to_float_table +
                      (ulong)phVar4[(int)uVar5 * lVar6 + (long)x]._h * 4);
    goto LAB_00108a86;
  case PERIODIC:
    iVar2 = Imath_3_2::modp(x_01,h);
    uVar3 = Imath_3_2::modp(x_00,h);
    break;
  case MIRROR:
    iVar2 = mirror(x_01,h);
    uVar3 = mirror(x_00,h);
    break;
  default:
    dVar7 = 0.0;
    dVar8 = 0.0;
    goto LAB_00108aae;
  }
  lVar6 = (channel->_pixels)._sizeY;
  phVar4 = (channel->_pixels)._data;
  fVar1 = *(float *)(_imath_half_to_float_table + (ulong)phVar4[iVar2 * lVar6 + (long)x]._h * 4);
LAB_00108a86:
  dVar7 = (double)fVar1;
  phVar4 = phVar4 + (int)uVar3 * lVar6 + (long)x;
LAB_00108a98:
  dVar8 = (double)*(float *)(_imath_half_to_float_table + (ulong)phVar4->_h * 4);
LAB_00108aae:
  return ((double)(int)x_00 - y) * dVar7 + (1.0 - ((double)(int)x_00 - y)) * dVar8;
}

Assistant:

double
sampleY (
    const TypedImageChannel<T>& channel,
    int                         h,
    int                         x,
    double                      y,
    Extrapolation               ext)
{
    //
    // Sample an image channel at location (x, y), where
    // x is an integer, and y is a floating point number.
    //

    int    ys = IMATH_NAMESPACE::floor (y);
    int    yt = ys + 1;
    double s  = yt - y;
    double t  = 1 - s;
    double vs = 0.0;
    double vt = 0.0;

    switch (ext)
    {
        case BLACK:

            vs = (ys >= 0 && ys < h) ? double (channel (x, ys)) : 0.0;
            vt = (yt >= 0 && yt < h) ? double (channel (x, yt)) : 0.0;
            break;

        case CLAMP:

            ys = IMATH_NAMESPACE::clamp (ys, 0, h - 1);
            yt = IMATH_NAMESPACE::clamp (yt, 0, h - 1);
            vs = channel (x, ys);
            vt = channel (x, yt);
            break;

        case PERIODIC:

            ys = modp (ys, h);
            yt = modp (yt, h);
            vs = channel (x, ys);
            vt = channel (x, yt);
            break;

        case MIRROR:

            ys = mirror (ys, h);
            yt = mirror (yt, h);
            vs = channel (x, ys);
            vt = channel (x, yt);
            break;
    }

    return s * vs + t * vt;
}